

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.h
# Opt level: O3

void __thiscall
ByteCodeGenerator::PushJumpCleanupForLoop(ByteCodeGenerator *this,ParseNode *loopNode,uint loopId)

{
  RealCount *pRVar1;
  JumpCleanupList *pJVar2;
  DListNodeBase<JumpCleanupInfo> *pDVar3;
  DListNode<JumpCleanupInfo> *pDVar4;
  
  pJVar2 = this->jumpCleanupList;
  pDVar4 = (DListNode<JumpCleanupInfo> *)
           new<Memory::ArenaAllocator>(0x30,pJVar2->allocator,0x364470);
  (pDVar4->data).loopNode = loopNode;
  (pDVar4->data).loopId = loopId;
  (pDVar4->data).tryOp = Nop;
  (pDVar4->data).label = 0;
  (pDVar4->data).regSlot1 = 0xffffffff;
  (pDVar4->data).regSlot2 = 0xffffffff;
  pDVar3 = (pJVar2->super_DListBase<JumpCleanupInfo,_RealCount>).
           super_DListNodeBase<JumpCleanupInfo>.next.base;
  (pDVar4->super_DListNodeBase<JumpCleanupInfo>).prev = pDVar3->prev;
  (pDVar4->super_DListNodeBase<JumpCleanupInfo>).next.base = pDVar3;
  *(DListNode<JumpCleanupInfo> **)pDVar3->prev = pDVar4;
  (pDVar3->prev).node = pDVar4;
  pRVar1 = &(pJVar2->super_DListBase<JumpCleanupInfo,_RealCount>).super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  return;
}

Assistant:

void PushJumpCleanupForLoop(ParseNode* loopNode, uint loopId)
    {
        this->jumpCleanupList->Prepend({
            loopNode,
            loopId,
            Js::OpCode::Nop,
            0,
            Js::Constants::NoRegister,
            Js::Constants::NoRegister
        });
    }